

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asc2log.c
# Opt level: O0

int main(int argc,char **argv)

{
  __time_t _Var1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar4;
  size_t sVar5;
  char **in_RSI;
  int in_EDI;
  unsigned_long_long usec;
  unsigned_long_long sec;
  int opt;
  FILE *outfile;
  FILE *infile;
  char tmp2 [10];
  char tmp1 [10];
  char buf [6500];
  undefined1 local_19b8 [8];
  FILE *in_stack_ffffffffffffe650;
  int disable_dir;
  undefined4 in_stack_ffffffffffffe670;
  undefined4 in_stack_ffffffffffffe674;
  char local_1982 [10];
  char local_1978 [128];
  FILE *in_stack_ffffffffffffe708;
  int in_stack_ffffffffffffe714;
  int in_stack_ffffffffffffe718;
  char in_stack_ffffffffffffe71f;
  timeval *in_stack_ffffffffffffe720;
  char *in_stack_ffffffffffffe728;
  int in_stack_ffffffffffffe76c;
  int in_stack_ffffffffffffe770;
  char in_stack_ffffffffffffe776;
  char in_stack_ffffffffffffe777;
  timeval *in_stack_ffffffffffffe778;
  char *in_stack_ffffffffffffe780;
  FILE *in_stack_ffffffffffffe7c0;
  
  __stream_00 = _stdout;
  __stream = _stdin;
  while (uVar2 = getopt(in_EDI,in_RSI,"I:O:dv?"), uVar2 != 0xffffffff) {
    if (uVar2 == 0x3f) {
      __xpg_basename(*in_RSI);
      print_usage((char *)0x1023f9);
      return 0;
    }
    if (uVar2 == 0x49) {
      __stream = fopen(_optarg,"r");
      if (__stream == (FILE *)0x0) {
        perror("infile");
        return 1;
      }
    }
    else if (uVar2 == 0x4f) {
      __stream_00 = fopen(_optarg,"w");
      if (__stream_00 == (FILE *)0x0) {
        perror("outfile");
        return 1;
      }
    }
    else if (uVar2 == 100) {
      main::disable_dir = 1;
    }
    else {
      if (uVar2 != 0x76) {
        fprintf(_stderr,"Unknown option %c\n",(ulong)uVar2);
        __xpg_basename(*in_RSI);
        print_usage((char *)0x10243d);
        return 1;
      }
      main::verbose = 1;
    }
  }
  disable_dir = -1;
LAB_00102454:
  do {
    while( true ) {
      pcVar4 = fgets(local_1978,0x1963,__stream);
      if (pcVar4 == (char *)0x0) {
        fclose(__stream_00);
        fclose(__stream);
        return 0;
      }
      if (main::dplace == 0) break;
LAB_001026a3:
      iVar3 = __isoc99_sscanf(local_1978,"%llu.%llu %9s ",&stack0xffffffffffffe650,local_19b8,
                              local_1982);
      if (iVar3 == 3) {
        iVar3 = strncmp(local_1982,"CANXL",5);
        if (iVar3 == 0) {
          eval_canxl((char *)CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
                     (timeval *)__stream,(char)((ulong)__stream_00 >> 0x38),(int)__stream_00,
                     disable_dir,in_stack_ffffffffffffe650);
        }
        else {
          iVar3 = strncmp(local_1982,"CANFD",5);
          if (iVar3 == 0) {
            eval_canfd(in_stack_ffffffffffffe728,in_stack_ffffffffffffe720,in_stack_ffffffffffffe71f
                       ,in_stack_ffffffffffffe718,in_stack_ffffffffffffe714,
                       in_stack_ffffffffffffe708);
          }
          else {
            eval_can(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778,in_stack_ffffffffffffe777,
                     in_stack_ffffffffffffe776,in_stack_ffffffffffffe770,in_stack_ffffffffffffe76c,
                     in_stack_ffffffffffffe7c0);
          }
        }
      }
    }
    if ((main::base != '\0') ||
       (iVar3 = __isoc99_sscanf(local_1978,"base %9s timestamps %9s",local_1982,
                                &stack0xffffffffffffe674), iVar3 != 2)) {
      if ((main::date_tv.tv_sec == 0) && (iVar3 = strncmp(local_1978,"date",4), iVar3 == 0)) {
        iVar3 = get_date((timeval *)__stream,(char *)__stream_00);
        if (iVar3 != 0) {
          fprintf(_stderr,"Not able to determine original log file date. Using current time.\n");
          gettimeofday((timeval *)&main::date_tv,(__timezone_ptr_t)0x0);
        }
        _Var1 = main::date_tv.tv_sec;
        if (main::verbose != 0) {
          pcVar4 = ctime(&main::date_tv.tv_sec);
          printf("date %llu => %s",_Var1,pcVar4);
        }
      }
      else {
        iVar3 = __isoc99_sscanf(local_1978,"%llu.%9s %9s ",&stack0xffffffffffffe650,
                                &stack0xffffffffffffe674,local_1982);
        if (iVar3 == 3) {
          sVar5 = strlen(&stack0xffffffffffffe674);
          main::dplace = (int)sVar5;
          if (main::verbose != 0) {
            printf("decimal place %d, e.g. \'%s\'\n",sVar5 & 0xffffffff,&stack0xffffffffffffe674);
          }
          if ((main::dplace < 4) || (6 < main::dplace)) {
            printf("invalid dplace %d (must be 4, 5 or 6)!\n",(ulong)(uint)main::dplace);
            return 1;
          }
          goto LAB_001026a3;
        }
      }
      goto LAB_00102454;
    }
    main::base = local_1982[0];
    main::timestamps = (char)in_stack_ffffffffffffe674;
    if (main::verbose != 0) {
      printf("base %c timestamps %c\n",(ulong)(uint)(int)local_1982[0],
             (ulong)(uint)(int)main::timestamps);
    }
    if ((main::base != 'h') && (main::base != 'd')) {
      printf("invalid base %s (must be \'hex\' or \'dez\')!\n",local_1982);
      return 1;
    }
    if ((main::timestamps != 'a') && (main::timestamps != 'r')) {
      printf("invalid timestamps %s (must be \'absolute\' or \'relative\')!\n",
             &stack0xffffffffffffe674);
      return 1;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
	char buf[BUFLEN], tmp1[10], tmp2[10];

	FILE *infile = stdin;
	FILE *outfile = stdout;
	static int verbose, disable_dir;
	static struct timeval date_tv; /* date of the ASC file */
	static int dplace; /* decimal place 4, 5 or 6 or uninitialized */
	static char base; /* 'd'ec or 'h'ex */
	static char timestamps; /* 'a'bsolute or 'r'elative */
	int opt;
	unsigned long long sec, usec;

	while ((opt = getopt(argc, argv, "I:O:dv?")) != -1) {
		switch (opt) {
		case 'I':
			infile = fopen(optarg, "r");
			if (!infile) {
				perror("infile");
				return 1;
			}
			break;

		case 'O':
			outfile = fopen(optarg, "w");
			if (!outfile) {
				perror("outfile");
				return 1;
			}
			break;

		case 'd':
			disable_dir = 1;
			break;

		case 'v':
			verbose = 1;
			break;

		case '?':
			print_usage(basename(argv[0]));
			return 0;
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			print_usage(basename(argv[0]));
			return 1;
			break;
		}
	}


	while (fgets(buf, BUFLEN-1, infile)) {

		if (!dplace) { /* the representation of a valid CAN frame not known */

			/* check for base and timestamp entries in the header */
			if ((!base) &&
			    (sscanf(buf, "base %9s timestamps %9s", tmp1, tmp2) == 2)) {
				base = tmp1[0];
				timestamps = tmp2[0];
				if (verbose)
					printf("base %c timestamps %c\n", base, timestamps);
				if ((base != 'h') && (base != 'd')) {
					printf("invalid base %s (must be 'hex' or 'dez')!\n",
					       tmp1);
					return 1;
				}
				if ((timestamps != 'a') && (timestamps != 'r')) {
					printf("invalid timestamps %s (must be 'absolute'"
					       " or 'relative')!\n", tmp2);
					return 1;
				}
				continue;
			}

			/* check for the original logging date in the header */ 
			if ((!date_tv.tv_sec) &&
			    (!strncmp(buf, "date", 4))) {

				if (get_date(&date_tv, &buf[9])) { /* skip 'date day ' */
					fprintf(stderr, "Not able to determine original log "
						"file date. Using current time.\n");
					/* use current date as default */
					gettimeofday(&date_tv, NULL);
				}
				if (verbose)
					printf("date %llu => %s", (unsigned long long)date_tv.tv_sec, ctime(&date_tv.tv_sec));
				continue;
			}

			/* check for decimal places length in valid CAN frames */
			if (sscanf(buf, "%llu.%9s %9s ", &sec, tmp2,
				   tmp1) != 3)
				continue; /* dplace remains zero until first found CAN frame */

			dplace = strlen(tmp2);
			if (verbose)
				printf("decimal place %d, e.g. '%s'\n", dplace,
				       tmp2);
			if (dplace < 4 || dplace > 6) {
				printf("invalid dplace %d (must be 4, 5 or 6)!\n",
				       dplace);
				return 1;
			}
		}

		/*
		 * The representation of a valid CAN frame is known here.
		 * So try to get CAN frames and ErrorFrames and convert them.
		 */

		/* check classic CAN format or the CANFD/CANXL tag which can take different types */
		if (sscanf(buf, "%llu.%llu %9s ", &sec,  &usec, tmp1) == 3) {
			if (!strncmp(tmp1, "CANXL", 5))
				eval_canxl(buf, &date_tv, timestamps, dplace, disable_dir, outfile);
			else if (!strncmp(tmp1, "CANFD", 5))
				eval_canfd(buf, &date_tv, timestamps, dplace, disable_dir, outfile);
			else
				eval_can(buf, &date_tv, timestamps, base, dplace, disable_dir, outfile);
		}
	}
	fclose(outfile);
	fclose(infile);
	return 0;
}